

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,rt_vector_expr<viennamath::rt_expression_interface<double>_> *e
                    )

{
  ostream *poVar1;
  size_type sVar2;
  const_reference e_00;
  ulong local_20;
  size_t i;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *e_local;
  ostream *stream_local;
  
  poVar1 = std::operator<<(stream,"[");
  sVar2 = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::size(&e->
                  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1,"](");
  local_20 = 0;
  while( true ) {
    sVar2 = std::
            vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
            ::size(&e->
                    super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                  );
    if (sVar2 <= local_20) break;
    e_00 = std::
           vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ::operator[](&e->
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ,local_20);
    operator<<(stream,e_00);
    sVar2 = std::
            vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
            ::size(&e->
                    super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                  );
    if (local_20 + 1 < sVar2) {
      std::operator<<(stream,", ");
    }
    local_20 = local_20 + 1;
  }
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_vector_expr<InterfaceType> const & e)
  {
    stream << "[" << e.size() << "](";
    for (std::size_t i=0; i<e.size(); ++i)
    {
      stream << e[i];
      if (i+1 < e.size())
        stream << ", ";
    }
    stream << ")";

    return stream;
  }